

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O3

LPCSTR NpyArray::ParseFooterZIP
                 (FILE *fp,uint16_t *nrecs,size_t *globalHeaderSize,size_t *globalHeaderOffset)

{
  size_t sVar1;
  char *pcVar2;
  char footer [32];
  undefined1 auStack_48 [10];
  uint16_t local_3e;
  uint local_3c;
  uint local_38;
  
  fseek((FILE *)fp,-0x16,2);
  sVar1 = fread(auStack_48,1,0x16,(FILE *)fp);
  if (sVar1 == 0x16) {
    *nrecs = local_3e;
    *globalHeaderSize = (ulong)local_3c;
    *globalHeaderOffset = (ulong)local_38;
    pcVar2 = (LPCSTR)0x0;
  }
  else {
    pcVar2 = "error: failed footer";
  }
  return pcVar2;
}

Assistant:

LPCSTR NpyArray::ParseFooterZIP(FILE* fp, uint16_t& nrecs, size_t& globalHeaderSize, size_t& globalHeaderOffset)
{
	char footer[32];
	fseek(fp, -22, SEEK_END);
	if (fread(footer, sizeof(char), 22, fp) != 22)
		return "error: failed footer";
	const uint16_t diskNo = *(uint16_t*)(footer+4); ASSERT(diskNo == 0);
	const uint16_t diskStart = *(uint16_t*)(footer+6); ASSERT(diskStart == 0);
	const uint16_t nrecsOnDisk = *(uint16_t*)(footer+8);
	nrecs = *(uint16_t*)(footer+10); ASSERT(nrecsOnDisk == nrecs);
	globalHeaderSize = *(uint32_t*)(footer+12);
	globalHeaderOffset = *(uint32_t*)(footer+16);
	const uint16_t lenComment = *(uint16_t*)(footer+20); ASSERT(lenComment == 0);
	return NULL;
}